

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O3

void __thiscall slang::parsing::Lexer::~Lexer(Lexer *this)

{
  pointer p;
  pointer p_00;
  
  p = (this->stringBuffer).super_SmallVectorBase<char>.data_;
  if (p != (this->stringBuffer).super_SmallVectorBase<char>.firstElement) {
    operator_delete(p);
  }
  p_00 = (this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.data_;
  if (p_00 != (pointer)(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.
                       firstElement) {
    operator_delete(p_00);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&this->options);
  return;
}

Assistant:

class SLANG_EXPORT Lexer {
public:
    Lexer(SourceBuffer buffer, BumpAllocator& alloc, Diagnostics& diagnostics,
          SourceManager& sourceManager, LexerOptions options = LexerOptions{});

    // Not copyable
    Lexer(const Lexer&) = delete;
    Lexer& operator=(const Lexer&) = delete;

    /// Lexes the next token from the source code.
    /// This will never return a null pointer; at the end of the buffer,
    /// an infinite stream of EndOfFile tokens will be generated
    Token lex();
    Token lex(KeywordVersion keywordVersion);

    /// Looks ahead in the source stream to see if the next token we would lex
    /// is on the same line as the previous token we've lexed.
    bool isNextTokenOnSameLine();

    /// Lexes a token that contains encoded text as part of a protected envelope.
    Token lexEncodedText(ProtectEncoding encoding, uint32_t expectedBytes, bool singleLine,
                         bool legacyProtectedMode);

    /// Returns the library with which the lexer's source buffer is associated.
    const SourceLibrary* getLibrary() const { return library; }

    /// Concatenates two tokens together; used for macro pasting.
    static Token concatenateTokens(BumpAllocator& alloc, SourceManager& sourceManager, Token left,
                                   Token right);

    /// Converts a range of tokens into a string literal; used for macro stringification.
    static Token stringify(Lexer& parentLexer, Token startToken, std::span<Token> bodyTokens,
                           Token endToken);

    /// Converts a range of tokens into a block comment; used for macro expansion.
    static Trivia commentify(BumpAllocator& alloc, SourceManager& sourceManager,
                             std::span<Token> tokens);

    /// Splits the given token at the specified offset into its raw source text. The trailing
    /// portion of the split is lexed into new tokens and appened to @a results
    static void splitTokens(BumpAllocator& alloc, Diagnostics& diagnostics,
                            SourceManager& sourceManager, Token sourceToken, size_t offset,
                            KeywordVersion keywordVersion, SmallVectorBase<Token>& results);

private:
    Lexer(BufferID bufferId, std::string_view source, const char* startPtr, BumpAllocator& alloc,
          Diagnostics& diagnostics, SourceManager& sourceManager, LexerOptions options);

    Token lexToken(KeywordVersion keywordVersion);
    Token lexEscapeSequence(bool isMacroName);
    Token lexNumericLiteral();
    Token lexDollarSign();
    Token lexDirective();
    Token lexApostrophe();

    Token lexStringLiteral();
    std::optional<TimeUnit> lexTimeLiteral();

    template<bool StopAfterNewline>
    void lexTrivia();

    void scanBlockComment();
    void scanLineComment();
    void scanWhitespace();
    void scanIdentifier();
    bool scanUTF8Char(bool alreadyErrored);
    bool scanUTF8Char(bool alreadyErrored, uint32_t* code, int& computedLen);
    void scanEncodedText(ProtectEncoding encoding, uint32_t expectedBytes, bool singleLine,
                         bool legacyProtectedMode);
    bool tryApplyCommentHandler();
    void scanDisabledRegion(std::string_view firstWord, std::string_view secondWord,
                            std::optional<std::string_view> thirdWord, DiagCode unclosedDiag);

    template<typename... Args>
    Token create(TokenKind kind, Args&&... args);

    void addTrivia(TriviaKind kind);
    Diagnostic& addDiag(DiagCode code, size_t offset);

    // source pointer manipulation
    void mark() { marker = sourceBuffer; }
    void advance() { sourceBuffer++; }
    void advance(int count) { sourceBuffer += count; }
    char peek() const { return *sourceBuffer; }
    char peek(int offset) const { return sourceBuffer[offset]; }
    size_t currentOffset() const;

    // in order to detect embedded nulls gracefully, we call this whenever we
    // encounter a null to check whether we really are at the end of the buffer
    bool reallyAtEnd() const { return sourceBuffer >= sourceEnd - 1; }

    uint32_t lexemeLength() const { return (uint32_t)(sourceBuffer - marker); }
    std::string_view lexeme() const { return std::string_view(marker, lexemeLength()); }

    bool consume(char c) {
        if (peek() == c) {
            advance();
            return true;
        }
        return false;
    }

    BumpAllocator& alloc;
    Diagnostics& diagnostics;
    LexerOptions options;

    // the source text and start and end pointers within it
    BufferID bufferId;
    const char* originalBegin;
    const char* sourceBuffer;
    const char* sourceEnd;

    // save our place in the buffer to measure out the current lexeme
    const char* marker;

    // the number of errors that have occurred while lexing the current buffer
    uint32_t errorCount = 0;

    // temporary storage for building arrays of trivia
    SmallVector<Trivia, 32> triviaBuffer;

    // temporary storage for building string literals
    SmallVector<char> stringBuffer;

    const SourceLibrary* library = nullptr;
    SourceManager& sourceManager;
}